

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

int http_send_body(http_s *r,void *data,uintptr_t length)

{
  uintptr_t length_local;
  void *data_local;
  http_s *r_local;
  
  if ((r == (http_s *)0x0) || (((r->method == 0 && (r->status_str == 0)) && (r->status != 0)))) {
    r_local._4_4_ = -1;
  }
  else if ((length == 0) || (data == (void *)0x0)) {
    http_finish(r);
    r_local._4_4_ = 0;
  }
  else {
    add_content_length(r,length);
    add_date(r);
    r_local._4_4_ = (**(r->private_data).vtbl)(r,data,length);
  }
  return r_local._4_4_;
}

Assistant:

int http_send_body(http_s *r, void *data, uintptr_t length) {
  if (HTTP_INVALID_HANDLE(r))
    return -1;
  if (!length || !data) {
    http_finish(r);
    return 0;
  }
  add_content_length(r, length);
  // add_content_type(r);
  add_date(r);
  return ((http_vtable_s *)r->private_data.vtbl)
      ->http_send_body(r, data, length);
}